

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O2

void * trico_open_archive_for_reading(uint8_t *data,uint64_t data_size)

{
  trico_archive *arch;
  ssize_t sVar1;
  int local_1c;
  
  arch = (trico_archive *)malloc(0x48);
  arch->data = (uint8_t *)0x0;
  arch->data_pointer = (uint8_t *)0x0;
  arch->data_size = 0;
  arch->size_available = 0;
  arch->buffer = (uint8_t *)0x0;
  arch->buffer_pointer = (uint8_t *)0x0;
  arch->writable = 0;
  arch->version = 0;
  arch->next_stream_type = trico_empty;
  arch->buffer_size = 0;
  arch->data = data;
  arch->data_pointer = data;
  arch->data_size = data_size;
  sVar1 = read((int)&local_1c,(void *)0x4,1);
  if ((((int)sVar1 != 0) && (local_1c == 0x6f637254)) &&
     (sVar1 = read((int)arch + 0x20,(void *)0x4,1), (int)sVar1 != 0)) {
    read_next_stream_type(arch);
    return arch;
  }
  free(arch);
  return (void *)0x0;
}

Assistant:

void* trico_open_archive_for_reading(const uint8_t* data, uint64_t data_size)
  {
  struct trico_archive* arch = (struct trico_archive*)trico_malloc(sizeof(struct trico_archive));
  arch->buffer = NULL;
  arch->buffer_pointer = NULL;
  arch->data = NULL;
  arch->data_pointer = NULL;
  arch->version = 0;
  arch->next_stream_type = trico_empty;
  arch->buffer_size = 0;
  arch->data_size = 0;
  arch->size_available = 0;
  arch->writable = 0;

  arch->data = data;
  arch->data_pointer = arch->data;
  arch->data_size = data_size;
  if (!read_header(arch))
    {
    trico_free(arch);
    return NULL;
    }
  return arch;
  }